

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int output_byte(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,uchar b)

{
  int local_20;
  uchar local_19;
  int result;
  uchar b_local;
  void *context_local;
  AMQPVALUE_ENCODER_OUTPUT encoder_output_local;
  
  if (encoder_output == (AMQPVALUE_ENCODER_OUTPUT)0x0) {
    local_20 = 0;
  }
  else {
    local_19 = b;
    _result = context;
    context_local = encoder_output;
    local_20 = (*encoder_output)(context,&local_19,1);
  }
  return local_20;
}

Assistant:

static int output_byte(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, unsigned char b)
{
    int result;

    if (encoder_output != NULL)
    {
        /* Codes_SRS_AMQPVALUE_01_267: [amqpvalue_encode shall pass the encoded bytes to the encoder_output function.] */
        /* Codes_SRS_AMQPVALUE_01_268: [On each call to the encoder_output function, amqpvalue_encode shall also pass the context argument.] */
        result = encoder_output(context, &b, 1);
    }
    else
    {
        result = 0;
    }

    return result;
}